

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHandler.cpp
# Opt level: O3

int __thiscall VideoHandler::preProcess(VideoHandler *this,string *videoInFile,string *targetName)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  char cVar2;
  element_type *peVar3;
  undefined1 local_39;
  VideoCapture *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  pointer local_20;
  
  local_20 = (videoInFile->_M_dataplus)._M_p;
  local_38 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cv::VideoCapture,std::allocator<cv::VideoCapture>,char_const*>
            (a_Stack_30,&local_38,(allocator<cv::VideoCapture> *)&local_39,&local_20);
  _Var1._M_pi = a_Stack_30[0]._M_pi;
  peVar3 = local_38;
  local_38 = (VideoCapture *)0x0;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_cap).super___shared_ptr<cv::VideoCapture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  this_00 = (this->m_cap).super___shared_ptr<cv::VideoCapture,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->m_cap).super___shared_ptr<cv::VideoCapture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
    }
    peVar3 = (this->m_cap).super___shared_ptr<cv::VideoCapture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if ((peVar3 != (element_type *)0x0) &&
     (cVar2 = (**(code **)(*(long *)peVar3 + 0x30))(), cVar2 != '\0')) {
    std::__cxx11::string::_M_assign((string *)&this->m_targetName);
    return 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Error open video file",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  return -1;
}

Assistant:

int VideoHandler::preProcess(const std::string &videoInFile, const std::string &targetName) 
{
    m_cap = std::make_shared<cv::VideoCapture>(videoInFile.c_str());
    if (!m_cap || !m_cap->isOpened()) 
    {
        std::cout << "Error open video file" << std::endl;
        return -1;
    }
 
    m_targetName = targetName;
    return 0;
}